

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comm.c
# Opt level: O2

void write_to_buffer(DESCRIPTOR_DATA *d,char *txt,int length)

{
  int iVar1;
  char *__src;
  size_t sVar2;
  char *__dest;
  int iVar3;
  string_view fmt;
  
  if (length < 1) {
    sVar2 = strlen(txt);
    length = (int)sVar2;
  }
  iVar3 = d->outtop;
  if ((iVar3 == 0) && (iVar3 = 0, d->fcommand == false)) {
    *d->outbuf = '\n';
    d->outbuf[1] = '\r';
    d->outtop = 2;
    iVar3 = 2;
  }
  while( true ) {
    iVar1 = d->outsize;
    if (iVar3 + length < iVar1) {
      strcpy(d->outbuf + iVar3,txt);
      d->outtop = d->outtop + length;
      return;
    }
    if (31999 < iVar1) break;
    d->outsize = (int)((long)iVar1 * 2);
    __dest = (char *)operator_new__((long)iVar1 * 2);
    __src = d->outbuf;
    strncpy(__dest,__src,(long)iVar3);
    if (__src != (char *)0x0) {
      operator_delete__(__src);
      iVar3 = d->outtop;
    }
    d->outbuf = __dest;
  }
  fmt._M_str = "Buffer overflow. Closing.\n\r";
  fmt._M_len = 0x1b;
  CLogger::Warn<>((CLogger *)&RS.field_0x140,fmt);
  d->outtop = 0;
  close_socket(d);
  return;
}

Assistant:

void write_to_buffer(DESCRIPTOR_DATA *d, const char *txt, int length)
{
	/*
	 * Find length in case caller didn't.
	 */
	if (length <= 0)
		length = strlen(txt);

	/*
	 * Initial \n\r if needed.
	 */
	if (d->outtop == 0 && !d->fcommand)
	{
		d->outbuf[0] = '\n';
		d->outbuf[1] = '\r';
		d->outtop = 2;
	}

	/*
	 * Expand the buffer as needed.
	 */
	while (d->outtop + length >= d->outsize)
	{
		char *outbuf;

		if (d->outsize >= 32000)
		{
			RS.Logger.Warn("Buffer overflow. Closing.\n\r");
			d->outtop = 0;
			close_socket(d);
			return;
		}

		d->outsize *= 2;
		outbuf = new char[d->outsize];
		strncpy(outbuf, d->outbuf, d->outtop);
		delete[] d->outbuf;
		d->outbuf = outbuf;
	}

	/*
	 * Copy.
	 */
	strcpy(d->outbuf + d->outtop, txt);
	d->outtop += length;
}